

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetOutputRecordTest_Test::TestBody(Psbt_SetOutputRecordTest_Test *this)

{
  allocator<unsigned_char> *this_00;
  pointer *ppuVar1;
  pointer *this_01;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  reference pvVar6;
  uchar *puVar7;
  size_type sVar8;
  uchar *puVar9;
  uint *puVar10;
  char *pcVar11;
  reference pvVar12;
  char *in_R9;
  AssertHelper local_1270;
  Message local_1268;
  ByteData local_1260;
  string local_1248;
  undefined1 local_1228 [8];
  AssertionResult gtest_ar_10;
  undefined1 local_1200 [8];
  ByteData output_bip32_key1;
  Message local_11e0;
  string local_11d8;
  undefined1 local_11b8 [8];
  AssertionResult gtest_ar_9;
  Message local_11a0;
  string local_1198;
  string local_1178;
  undefined1 local_1158 [8];
  AssertionResult gtest_ar_8;
  Message local_1140;
  string local_1138;
  string local_1118;
  undefined1 local_10f8 [8];
  AssertionResult gtest_ar_7;
  Message local_10e0;
  size_type local_10d8;
  int local_10cc;
  undefined1 local_10c8 [8];
  AssertionResult gtest_ar_6;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  Message local_1098;
  string local_1090;
  string local_1070;
  undefined1 local_1050 [8];
  AssertionResult gtest_ar_5;
  Message local_1038;
  string local_1030;
  string local_1010;
  undefined1 local_ff0 [8];
  AssertionResult gtest_ar_4;
  ByteData get_gval2;
  ByteData get_gval1;
  Psbt local_f98;
  string local_f48;
  AssertHelper local_f28;
  Message local_f20;
  bool local_f11;
  undefined1 local_f10 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_ee0;
  Message local_ed8;
  bool local_ec9;
  undefined1 local_ec8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e98;
  Message local_e90;
  bool local_e81;
  undefined1 local_e80 [8];
  AssertionResult gtest_ar_;
  string local_e68;
  undefined1 local_e48 [8];
  ByteData global_value2;
  string local_e28;
  allocator local_e01;
  string local_e00;
  undefined1 local_de0 [8];
  ByteData global_key2;
  string local_dc0;
  undefined1 local_da0 [8];
  ByteData global_value1;
  string local_d80;
  allocator local_d59;
  string local_d58;
  undefined1 local_d38 [8];
  ByteData global_key1;
  Message local_d18;
  string local_d10;
  string local_cf0;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar_3;
  Message local_cb8;
  string local_cb0;
  string local_c90;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar_2;
  KeyData get_val2;
  KeyData get_val1;
  undefined1 local_9a8 [8];
  Psbt psbt2;
  Message local_950;
  string local_948;
  undefined1 local_928 [8];
  AssertionResult gtest_ar_1;
  Message local_910;
  ByteData local_908;
  string local_8f0;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar;
  ByteData txout_value2;
  ByteData txout_key2;
  ByteData txout_value1;
  ByteData txout_key1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist1;
  undefined1 local_818 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp2;
  undefined1 local_7e8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp1;
  ByteData local_7b8;
  undefined1 local_7a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes2;
  ByteData local_770;
  undefined1 local_758 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_val_bytes;
  undefined1 local_720 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_key_bytes;
  undefined1 local_6f0 [8];
  Address addr2;
  undefined1 local_560 [8];
  Address addr1;
  KeyData key2;
  KeyData key1;
  undefined1 local_140 [8];
  string path2;
  undefined1 local_118 [8];
  string path1;
  undefined1 local_e0 [8];
  HDWallet wallet2;
  undefined1 local_b0 [8];
  HDWallet wallet1;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  Psbt psbt;
  Psbt_SetOutputRecordTest_Test *this_local;
  
  psbt.base_tx_.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,&local_81);
  cfd::core::Psbt::Psbt((Psbt *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet
            ((HDWallet *)local_b0,
             (ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)((long)&path1.field_2 + 8),&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_e0,(ByteData *)((long)&path1.field_2 + 8));
  cfd::core::ByteData::~ByteData((ByteData *)((long)&path1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_118,"44h/0h/0h/0/2",(allocator *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_140,"44h/0h/0h/0/2",
             (allocator *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_b0,kTestnet,
             (string *)local_118);
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (HDWallet *)local_e0,kTestnet,(string *)local_140);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Address::Address
            ((Address *)local_560,kCfdIllegalArgumentError,kVersion0,
             (Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::Address
            ((Address *)local_6f0,kCfdIllegalArgumentError,kVersion0,
             (Pubkey *)
             &txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = (allocator<unsigned_char> *)
            ((long)&txout_val_bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_720,0x22,this_00);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&txout_val_bytes.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_720,0);
  *pvVar6 = '\x02';
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::GetData
            (&local_770,
             (Pubkey *)
             &pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_758,&local_770);
  cfd::core::ByteData::~ByteData(&local_770);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Pubkey::GetData
            (&local_7b8,
             (Pubkey *)
             &fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0,&local_7b8);
  cfd::core::ByteData::~ByteData(&local_7b8);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetFingerprint
            ((ByteData *)
             &fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7e8,
             (ByteData *)
             &fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetFingerprint
            ((ByteData *)
             &plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818,
             (ByteData *)
             &plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetChildNumArray
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetChildNumArray
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &txout_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_720,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_758);
  pvVar6[0x20] = puVar7[0x20];
  uVar2 = *(undefined8 *)puVar7;
  uVar3 = *(undefined8 *)(puVar7 + 8);
  uVar4 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar4;
  *(undefined8 *)pvVar6 = uVar2;
  *(undefined8 *)(pvVar6 + 8) = uVar3;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,sVar8 * 4 + 4);
  ppuVar1 = &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7e8);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar9;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  this_01 = &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  memcpy(puVar7 + 4,puVar10,sVar8 << 2);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &txout_value1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_720);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &txout_key2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_720,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0);
  pvVar6[0x20] = puVar7[0x20];
  uVar2 = *(undefined8 *)puVar7;
  uVar3 = *(undefined8 *)(puVar7 + 8);
  uVar4 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar4;
  *(undefined8 *)pvVar6 = uVar2;
  *(undefined8 *)(pvVar6 + 8) = uVar3;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &txout_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,sVar8 * 4 + 4);
  ppuVar1 = &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar9;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  ppuVar1 = &txout_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
  memcpy(puVar7 + 4,puVar10,sVar8 << 2);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &txout_value2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_720);
  cfd::core::ByteData::ByteData
            ((ByteData *)&gtest_ar.message_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::SetTxOutRecord
            ((Psbt *)local_60,0,
             (ByteData *)
             &txout_value1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (ByteData *)
             &txout_key2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::SetTxOutRecord
            ((Psbt *)local_60,1,
             (ByteData *)
             &txout_value2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)&gtest_ar.message_);
  cfd::core::Psbt::GetData(&local_908,(Psbt *)local_60);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_8f0,&local_908);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8d0,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_8f0);
  cfd::core::ByteData::~ByteData(&local_908);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar5) {
    testing::Message::Message(&local_910);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3df,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_910);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_910);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_948,(Psbt *)local_60);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_928,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_948);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar5) {
    testing::Message::Message(&local_950);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3e0,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_950);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  cfd::core::Psbt::GetData
            ((ByteData *)
             &get_val1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Psbt *)local_60);
  cfd::core::Psbt::Psbt
            ((Psbt *)local_9a8,
             (ByteData *)
             &get_val1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_val1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxOutKeyData
            ((KeyData *)
             &get_val2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Psbt *)local_9a8,0,false);
  cfd::core::Psbt::GetTxOutKeyData((KeyData *)&gtest_ar_2.message_,(Psbt *)local_9a8,1,false);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_c90,
             (KeyData *)
             &get_val2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_cb0,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_c70,"get_val1.ToString()","key1.ToString()",&local_c90,
             &local_cb0);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::__cxx11::string::~string((string *)&local_c90);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
  if (!bVar5) {
    testing::Message::Message(&local_cb8);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3e5,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_cb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_cf0,(KeyData *)&gtest_ar_2.message_,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_d10,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_cd0,"get_val2.ToString()","key2.ToString()",&local_cf0,
             &local_d10);
  std::__cxx11::string::~string((string *)&local_d10);
  std::__cxx11::string::~string((string *)&local_cf0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd0);
  if (!bVar5) {
    testing::Message::Message(&local_d18);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_cd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3e6,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d18);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_d18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d58,"cfd",&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d80,"dummy1",
             (allocator *)
             ((long)&global_value1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Psbt::CreateRecordKey((ByteData *)local_d38,0xfc,&local_d58,'\0',&local_d80);
  std::__cxx11::string::~string((string *)&local_d80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_value1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_dc0,"01020304",
             (allocator *)
             ((long)&global_key2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_da0,&local_dc0);
  std::__cxx11::string::~string((string *)&local_dc0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_key2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e00,"cfd",&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e28,"dummy2",
             (allocator *)
             ((long)&global_value2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Psbt::CreateRecordKey((ByteData *)local_de0,0xfc,&local_e00,'\0',&local_e28);
  std::__cxx11::string::~string((string *)&local_e28);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_value2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e68,"00",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_e48,&local_e68);
  std::__cxx11::string::~string((string *)&local_e68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::Psbt::SetTxOutRecord((Psbt *)local_60,0,(ByteData *)local_d38,(ByteData *)local_da0);
  local_e81 = cfd::core::Psbt::IsFindTxOutRecord((Psbt *)local_60,0,(ByteData *)local_d38);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e80,&local_e81,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e80);
  if (!bVar5) {
    testing::Message::Message(&local_e90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_e80,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key1)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3ed,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e98,&local_e90);
    testing::internal::AssertHelper::~AssertHelper(&local_e98);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_e90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e80);
  bVar5 = cfd::core::Psbt::IsFindTxOutRecord((Psbt *)local_60,0,(ByteData *)local_de0);
  local_ec9 = (bool)(~bVar5 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ec8,&local_ec9,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec8);
  if (!bVar5) {
    testing::Message::Message(&local_ed8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_ec8,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","true","false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ee0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3ee,pcVar11);
    testing::internal::AssertHelper::operator=(&local_ee0,&local_ed8);
    testing::internal::AssertHelper::~AssertHelper(&local_ee0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_ed8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec8);
  cfd::core::Psbt::SetTxOutRecord((Psbt *)local_60,0,(ByteData *)local_de0,(ByteData *)local_e48);
  local_f11 = cfd::core::Psbt::IsFindTxOutRecord((Psbt *)local_60,0,(ByteData *)local_de0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f10,&local_f11,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f10);
  if (!bVar5) {
    testing::Message::Message(&local_f20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f48,(internal *)local_f10,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3f0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f28,&local_f20);
    testing::internal::AssertHelper::~AssertHelper(&local_f28);
    std::__cxx11::string::~string((string *)&local_f48);
    testing::Message::~Message(&local_f20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f10);
  cfd::core::Psbt::GetData
            ((ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_60);
  cfd::core::Psbt::Psbt
            (&local_f98,
             (ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::operator=((Psbt *)local_9a8,&local_f98);
  cfd::core::Psbt::~Psbt(&local_f98);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxOutRecord
            ((ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_9a8,0,
             (ByteData *)local_d38);
  cfd::core::Psbt::GetTxOutRecord
            ((ByteData *)&gtest_ar_4.message_,(Psbt *)local_9a8,0,(ByteData *)local_de0);
  cfd::core::ByteData::GetHex_abi_cxx11_
            (&local_1010,
             (ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1030,(ByteData *)local_da0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_ff0,"get_gval1.GetHex()","global_value1.GetHex()",&local_1010,
             &local_1030);
  std::__cxx11::string::~string((string *)&local_1030);
  std::__cxx11::string::~string((string *)&local_1010);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ff0);
  if (!bVar5) {
    testing::Message::Message(&local_1038);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_ff0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3f5,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1038);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ff0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1070,(ByteData *)&gtest_ar_4.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1090,(ByteData *)local_e48);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1050,"get_gval2.GetHex()","global_value2.GetHex()",&local_1070
             ,&local_1090);
  std::__cxx11::string::~string((string *)&local_1090);
  std::__cxx11::string::~string((string *)&local_1070);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1050);
  if (!bVar5) {
    testing::Message::Message(&local_1098);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1050);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3f6,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1098);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1098);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1050);
  cfd::core::Psbt::GetTxOutRecordKeyList
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_,(Psbt *)local_9a8,0);
  local_10cc = 2;
  local_10d8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          &gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_10c8,"2","key_list.size()",&local_10cc,&local_10d8);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10c8);
  if (!bVar5) {
    testing::Message::Message(&local_10e0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_10c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3f9,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_10e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_10e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10c8);
  sVar8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &gtest_ar_6.message_);
  if (sVar8 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1118,(ByteData *)local_d38);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &gtest_ar_6.message_,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1138,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_10f8,"global_key1.GetHex()","key_list[0].GetHex()",
               &local_1118,&local_1138);
    std::__cxx11::string::~string((string *)&local_1138);
    std::__cxx11::string::~string((string *)&local_1118);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10f8);
    if (!bVar5) {
      testing::Message::Message(&local_1140);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_10f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x3fb,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1140);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_1140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_10f8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1178,(ByteData *)local_de0);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &gtest_ar_6.message_,1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1198,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_1158,"global_key2.GetHex()","key_list[1].GetHex()",
               &local_1178,&local_1198);
    std::__cxx11::string::~string((string *)&local_1198);
    std::__cxx11::string::~string((string *)&local_1178);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1158);
    if (!bVar5) {
      testing::Message::Message(&local_11a0);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x3fc,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_11a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_11a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1158);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_11d8,(Psbt *)local_9a8);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_11b8,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_11d8);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11b8);
  if (!bVar5) {
    testing::Message::Message(&local_11e0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_11b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &output_bip32_key1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3fe,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &output_bip32_key1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_11e0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &output_bip32_key1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_11e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b8);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)&gtest_ar_10.message_,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::CreatePubkeyRecordKey
            ((ByteData *)local_1200,'\x02',(Pubkey *)&gtest_ar_10.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar_10.message_);
  cfd::core::Psbt::GetTxOutRecord(&local_1260,(Psbt *)local_9a8,0,(ByteData *)local_1200);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1248,&local_1260);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1228,"\"2a7047602c00008000000080000000800000000002000000\"",
             "psbt2.GetTxOutRecord(0, output_bip32_key1).GetHex().c_str()",
             "2a7047602c00008000000080000000800000000002000000",pcVar11);
  std::__cxx11::string::~string((string *)&local_1248);
  cfd::core::ByteData::~ByteData(&local_1260);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1228);
  if (!bVar5) {
    testing::Message::Message(&local_1268);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1228);
    testing::internal::AssertHelper::AssertHelper
              (&local_1270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x404,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1270,&local_1268);
    testing::internal::AssertHelper::~AssertHelper(&local_1270);
    testing::Message::~Message(&local_1268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1228);
  cfd::core::ByteData::~ByteData((ByteData *)local_1200);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_4.message_);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData((ByteData *)local_e48);
  cfd::core::ByteData::~ByteData((ByteData *)local_de0);
  cfd::core::ByteData::~ByteData((ByteData *)local_da0);
  cfd::core::ByteData::~ByteData((ByteData *)local_d38);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar_2.message_);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &get_val2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::~Psbt((Psbt *)local_9a8);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &txout_value2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &txout_key2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &txout_value1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &txout_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_758);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_720);
  cfd::core::Address::~Address((Address *)local_6f0);
  cfd::core::Address::~Address((Address *)local_560);
  cfd::core::KeyData::~KeyData
            ((KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_118);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_e0);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_b0);
  cfd::core::Psbt::~Psbt((Psbt *)local_60);
  return;
}

Assistant:

TEST(Psbt, SetOutputRecordTest) {
  Psbt psbt("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  std::vector<uint8_t> txout_key_bytes(34);
  std::vector<uint8_t> txout_val_bytes;
  txout_key_bytes[0] = 2;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txout_key_bytes[1], pk_bytes1.data(), 33);
  txout_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txout_val_bytes.data(), fp1.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txout_key_bytes);
  ByteData txout_value1 = ByteData(txout_val_bytes);

  memcpy(&txout_key_bytes[1], pk_bytes2.data(), 33);
  txout_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txout_val_bytes.data(), fp2.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txout_key_bytes);
  ByteData txout_value2 = ByteData(txout_val_bytes);

  psbt.SetTxOutRecord(0, txout_key1, txout_value1);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(0, txout_key1));
  // EXPECT_FALSE(psbt.IsFindTxOutRecord(1, txout_key2));
  psbt.SetTxOutRecord(1, txout_key2, txout_value2);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(1, txout_key2));

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxOutKeyData(0);
  auto get_val2 = psbt2.GetTxOutKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxOutRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxOutRecord(0, global_key2));
  psbt.SetTxOutRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxOutRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxOutRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxOutRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", psbt2.GetBase64().c_str());

  ByteData output_bip32_key1 = Psbt::CreatePubkeyRecordKey(
      Psbt::kPsbtOutputBip32Derivation, key1.GetPubkey());
  EXPECT_STREQ(
      "2a7047602c00008000000080000000800000000002000000",
      psbt2.GetTxOutRecord(0, output_bip32_key1).GetHex().c_str());
}